

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall duckdb::Vector::Slice(Vector *this,Vector *other,idx_t offset,idx_t end)

{
  LogicalType *other_00;
  PhysicalType type;
  data_ptr_t pdVar1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference this_02;
  pointer this_03;
  const_reference this_04;
  type other_01;
  Vector *this_05;
  Vector *other_02;
  idx_t i;
  ulong __n;
  idx_t iVar2;
  Vector new_vector;
  Vector local_c8;
  LogicalType local_60;
  LogicalType local_48;
  
  if (other->vector_type == FLAT_VECTOR) {
    other_00 = &this->type;
    type = (this->type).physical_type_;
    if (type == ARRAY) {
      LogicalType::LogicalType(&local_60,other_00);
      Vector(&local_c8,&local_60,0x800);
      LogicalType::~LogicalType(&local_60);
      this_05 = ArrayVector::GetEntryInternal<duckdb::Vector>(&local_c8);
      other_02 = ArrayVector::GetEntryInternal<duckdb::Vector_const>(other);
      iVar2 = ArrayType::GetSize(other_00);
      Slice(this_05,other_02,iVar2 * offset,iVar2 * end);
      ValidityMask::Slice((ValidityMask *)((long)&local_c8 + 0x28),&other->validity,offset,
                          end - offset);
      Reference(this,&local_c8);
    }
    else {
      if (type != STRUCT) {
        Reference(this,other);
        if (offset == 0) {
          return;
        }
        pdVar1 = this->data;
        iVar2 = GetTypeIdSize(type);
        this->data = pdVar1 + iVar2 * offset;
        ValidityMask::Slice(&this->validity,&other->validity,offset,end - offset);
        return;
      }
      LogicalType::LogicalType(&local_48,other_00);
      Vector(&local_c8,&local_48,0x800);
      LogicalType::~LogicalType(&local_48);
      this_00 = StructVector::GetEntries(&local_c8);
      this_01 = StructVector::GetEntries(other);
      for (__n = 0; __n < (ulong)((long)(this_00->
                                        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->
                                        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n = __n + 1) {
        this_02 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_00,__n);
        this_03 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (this_02);
        this_04 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_01,__n);
        other_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                             (this_04);
        Slice(this_03,other_01,offset,end);
      }
      ValidityMask::Slice((ValidityMask *)((long)&local_c8 + 0x28),&other->validity,offset,
                          end - offset);
      Reference(this,&local_c8);
    }
    ~Vector(&local_c8);
  }
  else {
    if (other->vector_type == CONSTANT_VECTOR) {
      Reference(this,other);
      return;
    }
    iVar2 = end - offset;
    SelectionVector::SelectionVector((SelectionVector *)&local_c8,iVar2);
    for (; end != offset; offset = offset + 1) {
      *(sel_t *)local_c8._0_8_ = (sel_t)offset;
      local_c8._0_8_ = local_c8._0_8_ + 4;
    }
    Slice(this,other,(SelectionVector *)&local_c8,iVar2);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_c8 + 0x10));
  }
  return;
}

Assistant:

void Vector::Slice(const Vector &other, idx_t offset, idx_t end) {
	D_ASSERT(end >= offset);
	if (other.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		Reference(other);
		return;
	}
	if (other.GetVectorType() != VectorType::FLAT_VECTOR) {
		// we can slice the data directly only for flat vectors
		// for non-flat vectors slice using a selection vector instead
		idx_t count = end - offset;
		SelectionVector sel(count);
		for (idx_t i = 0; i < count; i++) {
			sel.set_index(i, offset + i);
		}
		Slice(other, sel, count);
		return;
	}

	auto internal_type = GetType().InternalType();
	if (internal_type == PhysicalType::STRUCT) {
		Vector new_vector(GetType());
		auto &entries = StructVector::GetEntries(new_vector);
		auto &other_entries = StructVector::GetEntries(other);
		D_ASSERT(entries.size() == other_entries.size());
		for (idx_t i = 0; i < entries.size(); i++) {
			entries[i]->Slice(*other_entries[i], offset, end);
		}
		new_vector.validity.Slice(other.validity, offset, end - offset);
		Reference(new_vector);
	} else if (internal_type == PhysicalType::ARRAY) {
		Vector new_vector(GetType());
		auto &child_vec = ArrayVector::GetEntry(new_vector);
		auto &other_child_vec = ArrayVector::GetEntry(other);
		D_ASSERT(ArrayType::GetSize(GetType()) == ArrayType::GetSize(other.GetType()));
		const auto array_size = ArrayType::GetSize(GetType());
		// We need to slice the child vector with the multiplied offset and end
		child_vec.Slice(other_child_vec, offset * array_size, end * array_size);
		new_vector.validity.Slice(other.validity, offset, end - offset);
		Reference(new_vector);
	} else {
		Reference(other);
		if (offset > 0) {
			data = data + GetTypeIdSize(internal_type) * offset;
			validity.Slice(other.validity, offset, end - offset);
		}
	}
}